

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O3

intrusive_ptr<cppcms::application> __thiscall
cppcms::application_specific_pool::_legacy_pool_policy::get
          (_legacy_pool_policy *this,service *param_1)

{
  service *psVar1;
  
  (this->super__policy)._vptr__policy = (_func_int **)0x0;
  psVar1 = param_1[8].impl_.ptr_;
  if (psVar1 != (service *)0x0) {
    param_1[8].impl_.ptr_ = (service *)((long)&psVar1[-1].plugins_.ptr_ + 7);
    param_1[7].impl_.ptr_ = (service *)((long)&param_1[7].impl_.ptr_[-1].plugins_.ptr_ + 7);
    booster::intrusive_ptr<cppcms::application>::operator=
              ((intrusive_ptr<cppcms::application> *)this,
               *(application **)((long)param_1[3].impl_.ptr_ + (long)psVar1 * 8 + -8));
    (&(param_1[3].impl_.ptr_)->io_service_)[(long)param_1[8].impl_.ptr_]._M_t.
    super___uniq_ptr_impl<booster::aio::io_service,_std::default_delete<booster::aio::io_service>_>.
    _M_t.
    super__Tuple_impl<0UL,_booster::aio::io_service_*,_std::default_delete<booster::aio::io_service>_>
    .super__Head_base<0UL,_booster::aio::io_service_*,_false> =
         (_Head_base<0UL,_booster::aio::io_service_*,_false>)0x0;
  }
  return (intrusive_ptr<cppcms::application>)(application *)this;
}

Assistant:

virtual booster::intrusive_ptr<application> get(cppcms::service &)
	{
		booster::intrusive_ptr<application> app;
		// must never happen start
		if(size_ == 0)
			return app;
		// must never happen end
		size_--;
		pending_--;
		app = apps_[size_];
		apps_[size_] = 0;
		return app;
	}